

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_posix::basic_numpunct::basic_numpunct(basic_numpunct *this,locale_t lc)

{
  (this->grouping)._M_dataplus._M_p = (pointer)&(this->grouping).field_2;
  (this->grouping)._M_string_length = 0;
  (this->grouping).field_2._M_local_buf[0] = '\0';
  (this->thousands_sep)._M_dataplus._M_p = (pointer)&(this->thousands_sep).field_2;
  (this->thousands_sep)._M_string_length = 0;
  (this->thousands_sep).field_2._M_local_buf[0] = '\0';
  (this->decimal_point)._M_dataplus._M_p = (pointer)&(this->decimal_point).field_2;
  (this->decimal_point)._M_string_length = 0;
  (this->decimal_point).field_2._M_local_buf[0] = '\0';
  nl_langinfo_l(0x10001,(__locale_t)lc);
  std::__cxx11::string::assign((char *)&this->thousands_sep);
  nl_langinfo_l(0x10000,(__locale_t)lc);
  std::__cxx11::string::assign((char *)&this->decimal_point);
  nl_langinfo_l(0x10002,(__locale_t)lc);
  std::__cxx11::string::assign((char *)this);
  return;
}

Assistant:

basic_numpunct(locale_t lc) 
    {
    #if defined(__APPLE__) || defined(__FreeBSD__)
        lconv *cv = localeconv_l(lc);
        grouping = cv->grouping;
        thousands_sep = cv->thousands_sep;
        decimal_point = cv->decimal_point;
    #else
        thousands_sep = nl_langinfo_l(THOUSEP,lc);
        decimal_point = nl_langinfo_l(RADIXCHAR,lc);
        #ifdef GROUPING
        grouping = nl_langinfo_l(GROUPING,lc);
        #endif
    #endif
    }